

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

int strstart(char *str,char *val,char **ptr)

{
  char cVar1;
  char *q;
  char *pcVar2;
  
  cVar1 = *val;
  if (cVar1 != '\0') {
    pcVar2 = val + 1;
    do {
      if (*str != cVar1) {
        return 0;
      }
      str = str + 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  if (ptr != (char **)0x0) {
    *ptr = str;
  }
  return 1;
}

Assistant:

int strstart(const char *str, const char *val, const char **ptr)
{
    const char *p, *q;
    p = str;
    q = val;
    while (*q != '\0') {
        if (*p != *q)
            return 0;
        p++;
        q++;
    }
    if (ptr)
        *ptr = p;
    return 1;
}